

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionDispatcher.cpp
# Opt level: O3

void btCollisionDispatcher::defaultNearCallback
               (btBroadphasePair *collisionPair,btCollisionDispatcher *dispatcher,
               btDispatcherInfo *dispatchInfo)

{
  btCollisionObject *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionAlgorithm *pbVar3;
  int iVar4;
  undefined4 extraout_var;
  float extraout_XMM0_Da;
  btCollisionObjectWrapper obj1Wrap;
  btCollisionObjectWrapper obj0Wrap;
  btManifoldResult contactPointResult;
  btCollisionObjectWrapper local_a8;
  btCollisionObjectWrapper local_80;
  btManifoldResult local_58;
  
  pbVar1 = (btCollisionObject *)collisionPair->m_pProxy0->m_clientObject;
  pbVar2 = (btCollisionObject *)collisionPair->m_pProxy1->m_clientObject;
  iVar4 = (*(dispatcher->super_btDispatcher)._vptr_btDispatcher[6])(dispatcher,pbVar1,pbVar2);
  if ((char)iVar4 != '\0') {
    local_80.m_shape = pbVar1->m_collisionShape;
    local_80.m_worldTransform = &pbVar1->m_worldTransform;
    local_80.m_parent = (btCollisionObjectWrapper *)0x0;
    local_80.m_partId = -1;
    local_80.m_index = -1;
    local_a8.m_shape = pbVar2->m_collisionShape;
    local_a8.m_worldTransform = &pbVar2->m_worldTransform;
    local_a8.m_parent = (btCollisionObjectWrapper *)0x0;
    local_a8.m_partId = -1;
    local_a8.m_index = -1;
    local_a8.m_collisionObject = pbVar2;
    local_80.m_collisionObject = pbVar1;
    if (collisionPair->m_algorithm == (btCollisionAlgorithm *)0x0) {
      iVar4 = (*(dispatcher->super_btDispatcher)._vptr_btDispatcher[2])
                        (dispatcher,&local_80,&local_a8,0);
      collisionPair->m_algorithm = (btCollisionAlgorithm *)CONCAT44(extraout_var,iVar4);
      if ((btCollisionAlgorithm *)CONCAT44(extraout_var,iVar4) == (btCollisionAlgorithm *)0x0) {
        return;
      }
    }
    btManifoldResult::btManifoldResult(&local_58,&local_80,&local_a8);
    pbVar3 = collisionPair->m_algorithm;
    if (dispatchInfo->m_dispatchFunc == 1) {
      (*pbVar3->_vptr_btCollisionAlgorithm[2])(pbVar3,&local_80,&local_a8,dispatchInfo,&local_58);
    }
    else {
      (*pbVar3->_vptr_btCollisionAlgorithm[3])(pbVar3,pbVar1,pbVar2,dispatchInfo,&local_58);
      if (extraout_XMM0_Da < dispatchInfo->m_timeOfImpact) {
        dispatchInfo->m_timeOfImpact = extraout_XMM0_Da;
      }
    }
  }
  return;
}

Assistant:

void btCollisionDispatcher::defaultNearCallback(btBroadphasePair& collisionPair, btCollisionDispatcher& dispatcher, const btDispatcherInfo& dispatchInfo)
{
		btCollisionObject* colObj0 = (btCollisionObject*)collisionPair.m_pProxy0->m_clientObject;
		btCollisionObject* colObj1 = (btCollisionObject*)collisionPair.m_pProxy1->m_clientObject;

		if (dispatcher.needsCollision(colObj0,colObj1))
		{
			btCollisionObjectWrapper obj0Wrap(0,colObj0->getCollisionShape(),colObj0,colObj0->getWorldTransform(),-1,-1);
			btCollisionObjectWrapper obj1Wrap(0,colObj1->getCollisionShape(),colObj1,colObj1->getWorldTransform(),-1,-1);


			//dispatcher will keep algorithms persistent in the collision pair
			if (!collisionPair.m_algorithm)
			{
				collisionPair.m_algorithm = dispatcher.findAlgorithm(&obj0Wrap,&obj1Wrap);
			}

			if (collisionPair.m_algorithm)
			{
				btManifoldResult contactPointResult(&obj0Wrap,&obj1Wrap);
				
				if (dispatchInfo.m_dispatchFunc == 		btDispatcherInfo::DISPATCH_DISCRETE)
				{
					//discrete collision detection query
					
					collisionPair.m_algorithm->processCollision(&obj0Wrap,&obj1Wrap,dispatchInfo,&contactPointResult);
				} else
				{
					//continuous collision detection query, time of impact (toi)
					btScalar toi = collisionPair.m_algorithm->calculateTimeOfImpact(colObj0,colObj1,dispatchInfo,&contactPointResult);
					if (dispatchInfo.m_timeOfImpact > toi)
						dispatchInfo.m_timeOfImpact = toi;

				}
			}
		}

}